

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall
cppforth::Forth::ForthStack<unsigned_int>::moveStack
          (ForthStack<unsigned_int> *this,size_t to,size_t from,size_t count)

{
  reference __dest;
  reference __src;
  AbortException *this_00;
  allocator<char> local_51;
  string local_50;
  size_type local_30;
  size_type stackSize;
  size_t count_local;
  size_t from_local;
  size_t to_local;
  ForthStack<unsigned_int> *this_local;
  
  stackSize = count;
  count_local = from;
  from_local = to;
  to_local = (size_t)this;
  local_30 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->stack);
  if ((((this->top - from_local < local_30) && ((this->top - from_local) + stackSize < local_30)) &&
      (this->top - count_local < local_30)) && ((this->top - count_local) + stackSize < local_30)) {
    __dest = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->stack,this->top - from_local);
    __src = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      (&this->stack,this->top - count_local);
    memmove(__dest,__src,stackSize << 2);
    return;
  }
  this_00 = (AbortException *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"access of data stack outside of borders",&local_51);
  AbortException::AbortException(this_00,&local_50);
  __cxa_throw(this_00,&AbortException::typeinfo,AbortException::~AbortException);
}

Assistant:

void moveStack(size_t to, size_t from, size_t count){
				auto stackSize = stack.size();
				if (count >= 0 && (top - to) >= 0 && (top - to) < stackSize &&
					(top - to + count) < stackSize &&
					(top - from) >= 0 && (top - from) < stackSize &&
					(top - from + count) < stackSize
					){
					std::memmove(&stack[top - to], &stack[top - from], count * sizeof(CellType));
				}
				else {
					throw AbortException(std::string("access of data stack outside of borders"));
				}
			}